

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_x_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  uint uVar27;
  uint16_t *puVar28;
  int iVar29;
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [16];
  int iVar32;
  uint uVar33;
  undefined1 (*pauVar34) [16];
  ulong uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  short sVar49;
  int iVar50;
  short sVar55;
  int iVar56;
  short sVar58;
  int iVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar51 [16];
  int iVar62;
  undefined1 auVar52 [16];
  short sVar54;
  short sVar57;
  undefined1 auVar53 [16];
  short sVar63;
  int iVar64;
  int iVar68;
  int iVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  short local_48;
  short sStack_46;
  
  iVar32 = conv_params->round_0 + conv_params->round_1;
  cVar15 = (char)bd - (char)iVar32;
  uVar27 = 0xff;
  if (bd == 0xc) {
    uVar27 = 0xfff;
  }
  uVar33 = 0x3ff;
  if (bd != 10) {
    uVar33 = uVar27;
  }
  if (0 < w) {
    pauVar37 = (undefined1 (*) [16])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
    iVar26 = 7 - conv_params->round_1;
    iVar29 = (1 << (cVar15 + 0xdU & 0x1f)) + (1 << (cVar15 + 0xeU & 0x1f));
    pauVar31 = (undefined1 (*) [16])conv_params->dst;
    iVar2 = conv_params->fwd_offset;
    iVar3 = conv_params->bck_offset;
    iVar42 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    auVar43 = ZEXT416((uint)conv_params->round_0);
    uVar27 = 0xe - iVar32;
    auVar38 = pshuflw(ZEXT416(uVar33),ZEXT416(uVar33),0);
    iVar32 = conv_params->dst_stride;
    piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
    uVar16 = *(undefined4 *)piVar1;
    uVar17 = *(undefined4 *)(piVar1 + 2);
    uVar18 = *(undefined4 *)(piVar1 + 4);
    uVar19 = *(undefined4 *)(piVar1 + 6);
    iVar45 = (1 << ((byte)uVar27 & 0x1f)) >> 1;
    iVar4 = conv_params->do_average;
    iVar5 = conv_params->use_dist_wtd_comp_avg;
    iVar46 = iVar45 - iVar29;
    iVar47 = iVar45 - iVar29;
    iVar48 = iVar45 - iVar29;
    iVar45 = iVar45 - iVar29;
    uVar35 = 0;
    do {
      pauVar37 = pauVar37 + 1;
      puVar28 = dst0;
      pauVar30 = pauVar37;
      pauVar34 = pauVar31;
      uVar36 = (ulong)(uint)h;
      if (0 < h) {
        do {
          auVar41 = pauVar30[-1];
          auVar44 = *pauVar30;
          auVar6._16_16_ = auVar44;
          auVar6._0_16_ = auVar41;
          auVar7._16_16_ = auVar44;
          auVar7._0_16_ = auVar41;
          auVar8._16_16_ = auVar44;
          auVar8._0_16_ = auVar41;
          auVar65._4_4_ = uVar18;
          auVar65._0_4_ = uVar18;
          auVar65._8_4_ = uVar18;
          auVar65._12_4_ = uVar18;
          auVar71 = pmaddwd(auVar7._8_16_,auVar65);
          auVar72._4_4_ = uVar19;
          auVar72._0_4_ = uVar19;
          auVar72._8_4_ = uVar19;
          auVar72._12_4_ = uVar19;
          auVar39 = pmaddwd(auVar8._12_16_,auVar72);
          auVar40._0_4_ = auVar39._0_4_ + auVar71._0_4_;
          auVar40._4_4_ = auVar39._4_4_ + auVar71._4_4_;
          auVar40._8_4_ = auVar39._8_4_ + auVar71._8_4_;
          auVar40._12_4_ = auVar39._12_4_ + auVar71._12_4_;
          auVar9._16_16_ = auVar44;
          auVar9._0_16_ = auVar41;
          auVar10._16_16_ = auVar44;
          auVar10._0_16_ = auVar41;
          auVar11._16_16_ = auVar44;
          auVar11._0_16_ = auVar41;
          auVar12._16_16_ = auVar44;
          auVar12._0_16_ = auVar41;
          auVar44._4_4_ = uVar16;
          auVar44._0_4_ = uVar16;
          auVar44._8_4_ = uVar16;
          auVar44._12_4_ = uVar16;
          auVar65 = pmaddwd(auVar41,auVar44);
          auVar39._4_4_ = uVar17;
          auVar39._0_4_ = uVar17;
          auVar39._8_4_ = uVar17;
          auVar39._12_4_ = uVar17;
          auVar44 = pmaddwd(auVar6._4_16_,auVar39);
          auVar41._4_4_ = uVar16;
          auVar41._0_4_ = uVar16;
          auVar41._8_4_ = uVar16;
          auVar41._12_4_ = uVar16;
          auVar72 = pmaddwd(auVar9._2_16_,auVar41);
          auVar71._4_4_ = uVar17;
          auVar71._0_4_ = uVar17;
          auVar71._8_4_ = uVar17;
          auVar71._12_4_ = uVar17;
          auVar41 = pmaddwd(auVar10._6_16_,auVar71);
          auVar13._4_4_ = uVar18;
          auVar13._0_4_ = uVar18;
          auVar13._8_4_ = uVar18;
          auVar13._12_4_ = uVar18;
          auVar71 = pmaddwd(auVar11._10_16_,auVar13);
          auVar14._4_4_ = uVar19;
          auVar14._0_4_ = uVar19;
          auVar14._8_4_ = uVar19;
          auVar14._12_4_ = uVar19;
          auVar39 = pmaddwd(auVar12._14_16_,auVar14);
          auVar51._0_4_ =
               ((auVar65._0_4_ + iVar42 + auVar44._0_4_ + auVar40._0_4_ >> auVar43) << iVar26) +
               iVar29;
          auVar51._4_4_ =
               ((auVar72._0_4_ + iVar42 + auVar71._0_4_ + auVar41._0_4_ + auVar39._0_4_ >> auVar43)
               << iVar26) + iVar29;
          auVar51._8_4_ =
               (auVar65._4_4_ + iVar42 + auVar44._4_4_ + auVar40._4_4_ >> auVar43) + iVar29;
          auVar51._12_4_ =
               (auVar72._4_4_ + iVar42 + auVar71._4_4_ + auVar41._4_4_ + auVar39._4_4_ >> auVar43) +
               iVar29;
          local_48 = auVar38._0_2_;
          sStack_46 = auVar38._2_2_;
          if ((long)((ulong)(uint)w - 8) < (long)uVar35) {
            if (iVar4 == 0) {
              auVar41 = packusdw(auVar51,auVar51);
              *(long *)*pauVar34 = auVar41._0_8_;
            }
            else {
              auVar41 = pmovzxwd(auVar40,*(undefined8 *)*pauVar34);
              if (iVar5 == 0) {
                iVar50 = auVar51._0_4_ + auVar41._0_4_ >> 1;
                iVar56 = auVar51._4_4_ + auVar41._4_4_ >> 1;
                iVar59 = auVar51._8_4_ + auVar41._8_4_ >> 1;
                iVar62 = auVar51._12_4_ + auVar41._12_4_ >> 1;
              }
              else {
                auVar23._4_4_ = iVar2;
                auVar23._0_4_ = iVar2;
                auVar23._8_4_ = iVar2;
                auVar23._12_4_ = iVar2;
                auVar41 = pmulld(auVar41,auVar23);
                auVar20._4_4_ = iVar3;
                auVar20._0_4_ = iVar3;
                auVar20._8_4_ = iVar3;
                auVar20._12_4_ = iVar3;
                auVar44 = pmulld(auVar51,auVar20);
                iVar50 = auVar44._0_4_ + auVar41._0_4_ >> 4;
                iVar56 = auVar44._4_4_ + auVar41._4_4_ >> 4;
                iVar59 = auVar44._8_4_ + auVar41._8_4_ >> 4;
                iVar62 = auVar44._12_4_ + auVar41._12_4_ >> 4;
              }
              auVar41 = ZEXT416(uVar27);
              auVar52._0_4_ = iVar50 + iVar46 >> auVar41;
              auVar52._4_4_ = iVar56 + iVar47 >> auVar41;
              auVar52._8_4_ = iVar59 + iVar48 >> auVar41;
              auVar52._12_4_ = iVar62 + iVar45 >> auVar41;
              auVar41 = packusdw(auVar52,auVar52);
              sVar49 = auVar41._0_2_;
              sVar54 = auVar41._2_2_;
              sVar55 = auVar41._4_2_;
              sVar57 = auVar41._6_2_;
              *(ulong *)puVar28 =
                   CONCAT26((ushort)(sStack_46 < sVar57) * sStack_46 |
                            (ushort)(sStack_46 >= sVar57) * sVar57,
                            CONCAT24((ushort)(local_48 < sVar55) * local_48 |
                                     (ushort)(local_48 >= sVar55) * sVar55,
                                     CONCAT22((ushort)(sStack_46 < sVar54) * sStack_46 |
                                              (ushort)(sStack_46 >= sVar54) * sVar54,
                                              (ushort)(local_48 < sVar49) * local_48 |
                                              (ushort)(local_48 >= sVar49) * sVar49)));
            }
          }
          else {
            auVar66._0_4_ =
                 (auVar65._8_4_ + iVar42 + auVar44._8_4_ + auVar40._8_4_ >> auVar43) + iVar29;
            auVar66._4_4_ =
                 (auVar72._8_4_ + iVar42 + auVar71._8_4_ + auVar41._8_4_ + auVar39._8_4_ >> auVar43)
                 + iVar29;
            auVar66._8_4_ =
                 (auVar65._12_4_ + iVar42 + auVar44._12_4_ + auVar40._12_4_ >> auVar43) + iVar29;
            auVar66._12_4_ =
                 (auVar72._12_4_ + iVar42 + auVar71._12_4_ + auVar41._12_4_ + auVar39._12_4_ >>
                 auVar43) + iVar29;
            if (iVar4 == 0) {
              auVar41 = packusdw(auVar51,auVar66);
              *pauVar34 = auVar41;
            }
            else {
              auVar41 = *pauVar34;
              auVar44 = pmovzxwd(auVar40,auVar41);
              if (iVar5 == 0) {
                iVar50 = auVar51._0_4_ + auVar44._0_4_ >> 1;
                iVar56 = auVar51._4_4_ + auVar44._4_4_ >> 1;
                iVar59 = auVar51._8_4_ + auVar44._8_4_ >> 1;
                iVar62 = auVar51._12_4_ + auVar44._12_4_ >> 1;
              }
              else {
                auVar24._4_4_ = iVar2;
                auVar24._0_4_ = iVar2;
                auVar24._8_4_ = iVar2;
                auVar24._12_4_ = iVar2;
                auVar44 = pmulld(auVar44,auVar24);
                auVar21._4_4_ = iVar3;
                auVar21._0_4_ = iVar3;
                auVar21._8_4_ = iVar3;
                auVar21._12_4_ = iVar3;
                auVar39 = pmulld(auVar51,auVar21);
                iVar50 = auVar39._0_4_ + auVar44._0_4_ >> 4;
                iVar56 = auVar39._4_4_ + auVar44._4_4_ >> 4;
                iVar59 = auVar39._8_4_ + auVar44._8_4_ >> 4;
                iVar62 = auVar39._12_4_ + auVar44._12_4_ >> 4;
              }
              auVar73._0_4_ = CONCAT22(0,auVar41._8_2_);
              auVar73._4_2_ = auVar41._10_2_;
              auVar73._6_2_ = 0;
              auVar73._8_2_ = auVar41._12_2_;
              auVar73._10_2_ = 0;
              auVar73._12_2_ = auVar41._14_2_;
              auVar73._14_2_ = 0;
              if (iVar5 == 0) {
                iVar64 = (int)(auVar66._0_4_ + auVar73._0_4_) >> 1;
                iVar68 = (int)(auVar66._4_4_ + (uint)auVar41._10_2_) >> 1;
                iVar69 = (int)(auVar66._8_4_ + (uint)auVar41._12_2_) >> 1;
                iVar70 = (int)(auVar66._12_4_ + (uint)auVar41._14_2_) >> 1;
              }
              else {
                auVar25._4_4_ = iVar2;
                auVar25._0_4_ = iVar2;
                auVar25._8_4_ = iVar2;
                auVar25._12_4_ = iVar2;
                auVar44 = pmulld(auVar73,auVar25);
                auVar22._4_4_ = iVar3;
                auVar22._0_4_ = iVar3;
                auVar22._8_4_ = iVar3;
                auVar22._12_4_ = iVar3;
                auVar41 = pmulld(auVar66,auVar22);
                iVar64 = auVar41._0_4_ + auVar44._0_4_ >> 4;
                iVar68 = auVar41._4_4_ + auVar44._4_4_ >> 4;
                iVar69 = auVar41._8_4_ + auVar44._8_4_ >> 4;
                iVar70 = auVar41._12_4_ + auVar44._12_4_ >> 4;
              }
              auVar41 = ZEXT416(uVar27);
              auVar53._0_4_ = iVar50 + iVar46 >> auVar41;
              auVar53._4_4_ = iVar56 + iVar47 >> auVar41;
              auVar53._8_4_ = iVar59 + iVar48 >> auVar41;
              auVar53._12_4_ = iVar62 + iVar45 >> auVar41;
              auVar67._0_4_ = iVar64 + iVar46 >> auVar41;
              auVar67._4_4_ = iVar68 + iVar47 >> auVar41;
              auVar67._8_4_ = iVar69 + iVar48 >> auVar41;
              auVar67._12_4_ = iVar70 + iVar45 >> auVar41;
              auVar41 = packusdw(auVar53,auVar67);
              sVar49 = auVar41._0_2_;
              sVar54 = auVar41._2_2_;
              sVar55 = auVar41._4_2_;
              sVar57 = auVar41._6_2_;
              sVar58 = auVar41._8_2_;
              sVar60 = auVar41._10_2_;
              sVar61 = auVar41._12_2_;
              sVar63 = auVar41._14_2_;
              *puVar28 = (ushort)(local_48 < sVar49) * local_48 |
                         (ushort)(local_48 >= sVar49) * sVar49;
              puVar28[1] = (ushort)(sStack_46 < sVar54) * sStack_46 |
                           (ushort)(sStack_46 >= sVar54) * sVar54;
              puVar28[2] = (ushort)(local_48 < sVar55) * local_48 |
                           (ushort)(local_48 >= sVar55) * sVar55;
              puVar28[3] = (ushort)(sStack_46 < sVar57) * sStack_46 |
                           (ushort)(sStack_46 >= sVar57) * sVar57;
              puVar28[4] = (ushort)(local_48 < sVar58) * local_48 |
                           (ushort)(local_48 >= sVar58) * sVar58;
              puVar28[5] = (ushort)(sStack_46 < sVar60) * sStack_46 |
                           (ushort)(sStack_46 >= sVar60) * sVar60;
              puVar28[6] = (ushort)(local_48 < sVar61) * local_48 |
                           (ushort)(local_48 >= sVar61) * sVar61;
              puVar28[7] = (ushort)(sStack_46 < sVar63) * sStack_46 |
                           (ushort)(sStack_46 >= sVar63) * sVar63;
            }
          }
          uVar36 = uVar36 - 1;
          puVar28 = puVar28 + dst_stride0;
          pauVar30 = (undefined1 (*) [16])(*pauVar30 + (long)src_stride * 2);
          pauVar34 = (undefined1 (*) [16])(*pauVar34 + (long)iVar32 * 2);
        } while (uVar36 != 0);
      }
      uVar35 = uVar35 + 8;
      pauVar31 = pauVar31 + 1;
      dst0 = dst0 + 8;
    } while (uVar35 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m128i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 1) {
      const __m128i row00 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
      const __m128i row01 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

      // even pixels
      s[0] = _mm_alignr_epi8(row01, row00, 0);
      s[1] = _mm_alignr_epi8(row01, row00, 4);
      s[2] = _mm_alignr_epi8(row01, row00, 8);
      s[3] = _mm_alignr_epi8(row01, row00, 12);

      __m128i res_even = convolve(s, coeffs_x);
      res_even =
          _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x), round_shift_x);

      // odd pixels
      s[0] = _mm_alignr_epi8(row01, row00, 2);
      s[1] = _mm_alignr_epi8(row01, row00, 6);
      s[2] = _mm_alignr_epi8(row01, row00, 10);
      s[3] = _mm_alignr_epi8(row01, row00, 14);

      __m128i res_odd = convolve(s, coeffs_x);
      res_odd =
          _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x), round_shift_x);

      res_even = _mm_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm_sll_epi32(res_odd, round_shift_bits);

      __m128i res1 = _mm_unpacklo_epi32(res_even, res_odd);
      __m128i res_unsigned_lo = _mm_add_epi32(res1, offset_const);
      if (w - j < 8) {
        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);

          const __m128i comp_avg_res = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i round_result = highbd_convolve_rounding_sse2(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b = _mm_packus_epi32(round_result, round_result);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b);
        }
      } else {
        __m128i res2 = _mm_unpackhi_epi32(res_even, res_odd);
        __m128i res_unsigned_hi = _mm_add_epi32(res2, offset_const);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
        }
      }
    }
  }
}